

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O2

SHADER_STATUS __thiscall
Diligent::SerializedShaderImpl::GetStatus(SerializedShaderImpl *this,bool WaitForCompletion)

{
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> _Var1;
  SHADER_STATUS SVar2;
  SHADER_STATUS SVar3;
  long lVar4;
  string msg;
  
  SVar3 = SHADER_STATUS_READY;
  for (lVar4 = 0; SVar2 = SVar3, lVar4 != 7; lVar4 = lVar4 + 1) {
    _Var1._M_head_impl =
         (this->m_Shaders)._M_elems[lVar4]._M_t.
         super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
         ._M_t.
         super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
         .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>.
         _M_head_impl;
    if (_Var1._M_head_impl != (CompiledShader *)0x0) {
      SVar2 = (*(_Var1._M_head_impl)->_vptr_CompiledShader[4])(_Var1._M_head_impl,WaitForCompletion)
      ;
      switch(SVar2) {
      case SHADER_STATUS_UNINITIALIZED:
        FormatString<char[40]>(&msg,(char (*) [40])"Shader status must not be uninitialized");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedShaderImpl.cpp"
                   ,0xd0);
        break;
      case SHADER_STATUS_COMPILING:
        goto switchD_001d21a9_caseD_1;
      case SHADER_STATUS_READY:
        goto switchD_001d21a9_caseD_2;
      case SHADER_STATUS_FAILED:
        goto switchD_001d21a9_caseD_3;
      default:
        FormatString<char[25]>(&msg,(char (*) [25])"Unexpected shader status");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedShaderImpl.cpp"
                   ,0xdf);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
switchD_001d21a9_caseD_2:
    SVar2 = SVar3;
switchD_001d21a9_caseD_1:
    SVar3 = SVar2;
  }
switchD_001d21a9_caseD_3:
  return SVar2;
}

Assistant:

SHADER_STATUS SerializedShaderImpl::GetStatus(bool WaitForCompletion)
{
    SHADER_STATUS OverallStatus = SHADER_STATUS_READY;
    for (size_t type = 0; type < static_cast<size_t>(DeviceType::Count); ++type)
    {
        const auto& pCompiledShader = m_Shaders[type];
        if (!pCompiledShader)
            continue;

        const SHADER_STATUS Status = pCompiledShader->GetStatus(WaitForCompletion);
        switch (Status)
        {
            case SHADER_STATUS_UNINITIALIZED:
                UNEXPECTED("Shader status must not be uninitialized");
                break;

            case SHADER_STATUS_COMPILING:
                OverallStatus = SHADER_STATUS_COMPILING;
                break;

            case SHADER_STATUS_READY:
                // Nothing to do
                break;

            case SHADER_STATUS_FAILED:
                return SHADER_STATUS_FAILED;

            default:
                UNEXPECTED("Unexpected shader status");
                break;
        }
    }

    return OverallStatus;
}